

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

bool __thiscall BanMan::Unban(BanMan *this,CNetAddr *net_addr)

{
  bool bVar1;
  long in_FS_OFFSET;
  CSubNet sub_net;
  direct_or_indirect local_50;
  uint local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet((CSubNet *)&local_50.indirect_contents,net_addr);
  bVar1 = Unban(this,(CSubNet *)&local_50.indirect_contents);
  if (0x10 < local_40) {
    free(local_50.indirect_contents.indirect);
    local_50.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BanMan::Unban(const CNetAddr& net_addr)
{
    CSubNet sub_net(net_addr);
    return Unban(sub_net);
}